

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_cParam_clampBounds(ZSTD_cParameter cParam,int *value)

{
  uint uVar1;
  int *in_RSI;
  ZSTD_bounds ZVar2;
  ZSTD_bounds bounds;
  undefined4 uStack_20;
  undefined1 local_28 [16];
  undefined4 uStack_1c;
  undefined8 local_8;
  
  ZVar2 = ZSTD_cParam_getBounds(local_28._4_4_);
  uVar1 = ZSTD_isError(0x1e5f18);
  if (uVar1 == 0) {
    uStack_20 = ZVar2.lowerBound;
    if (*in_RSI < uStack_20) {
      *in_RSI = uStack_20;
    }
    uStack_1c = ZVar2.upperBound;
    if (uStack_1c < *in_RSI) {
      *in_RSI = uStack_1c;
    }
    local_8 = 0;
  }
  else {
    local_8 = ZVar2.error;
  }
  return local_8;
}

Assistant:

static size_t ZSTD_cParam_clampBounds(ZSTD_cParameter cParam, int* value)
{
    ZSTD_bounds const bounds = ZSTD_cParam_getBounds(cParam);
    if (ZSTD_isError(bounds.error)) return bounds.error;
    if (*value < bounds.lowerBound) *value = bounds.lowerBound;
    if (*value > bounds.upperBound) *value = bounds.upperBound;
    return 0;
}